

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool fs_validate_filename(string *filename)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  u32string filename_utf32;
  string filename_reencoded;
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  converter;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_c0;
  wide_string local_a0;
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  local_80;
  
  if (filename->_M_string_length - 0x100 < 0xffffffffffffff01) {
    bVar4 = false;
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = L'\0';
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
    ::wstring_convert(&local_80);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
    ::from_bytes(&local_a0,&local_80,filename);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(&local_c0,&local_a0);
    std::__cxx11::u32string::~u32string((u32string *)&local_a0);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
    ::to_bytes((byte_string *)&local_a0,&local_80,&local_c0);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_a0,filename);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
    ::~wstring_convert(&local_80);
    if (bVar4) {
LAB_0012674a:
      bVar4 = false;
    }
    else {
      lVar5 = 0;
      while (local_c0._M_string_length << 2 != lVar5) {
        uVar2 = *(uint *)((long)local_c0._M_dataplus._M_p + lVar5);
        bVar4 = false;
        if ((((uVar2 < 0x20) || (uVar2 == 0x7f)) || (bVar4 = false, (uVar2 & 0xffffffe0) == 0x80))
           || ((bVar4 = false, uVar2 - 0x2215 < 2 || (uVar2 == 0xff0e)))) goto LAB_0012674d;
        if ((uVar2 & 0xfffff800) == 0xd800) goto LAB_0012674a;
        bVar4 = false;
        if (((uVar2 - 0x22 < 0x3b) &&
            ((0x400000035002101U >> ((ulong)(uVar2 - 0x22) & 0x3f) & 1) != 0)) ||
           ((uVar2 == 0x7c || ((uVar2 == 0xfeff || (lVar5 = lVar5 + 4, uVar2 == 0xfffd))))))
        goto LAB_0012674d;
      }
      pcVar3 = (filename->_M_dataplus)._M_p;
      if (*pcVar3 == ' ') goto LAB_0012674a;
      cVar1 = pcVar3[filename->_M_string_length - 1];
      bVar4 = false;
      if ((cVar1 != ' ') && (cVar1 != '.')) {
        bVar4 = false;
        lVar5 = std::__cxx11::string::find((char *)filename,0x13a568);
        if (lVar5 == -1) {
          bVar4 = std::operator==(filename,".");
          bVar4 = !bVar4;
        }
      }
    }
LAB_0012674d:
    std::__cxx11::u32string::~u32string((u32string *)&local_c0);
  }
  return bVar4;
}

Assistant:

bool fs_validate_filename(const std::string & filename) {
    if (!filename.length()) {
        // Empty filename invalid
        return false;
    }
    if (filename.length() > 255) {
        // Limit at common largest possible filename on Linux filesystems
        // to avoid unnecessary further validation
        // (On systems with smaller limits it will be caught by the OS)
        return false;
    }

    std::u32string filename_utf32;
    try {
#if defined(__clang__)
        // disable C++17 deprecation warning for std::codecvt_utf8
#    pragma clang diagnostic push
#    pragma clang diagnostic ignored "-Wdeprecated-declarations"
#endif
        std::wstring_convert<std::codecvt_utf8<char32_t>, char32_t> converter;

#if defined(__clang__)
#    pragma clang diagnostic pop
#endif

        filename_utf32 = converter.from_bytes(filename);

        // If the reverse conversion mismatches, it means overlong UTF-8 sequences were used,
        // or invalid encodings were encountered. Reject such attempts
        std::string filename_reencoded = converter.to_bytes(filename_utf32);
        if (filename_reencoded != filename) {
            return false;
        }
    } catch (const std::exception &) {
        return false;
    }

    // Check for forbidden codepoints:
    // - Control characters
    // - Unicode equivalents of illegal characters
    // - UTF-16 surrogate pairs
    // - UTF-8 replacement character
    // - Byte order mark (BOM)
    // - Illegal characters: / \ : * ? " < > |
    for (char32_t c : filename_utf32) {
        if (c <= 0x1F // Control characters (C0)
            || c == 0x7F // Control characters (DEL)
            || (c >= 0x80 && c <= 0x9F) // Control characters (C1)
            || c == 0xFF0E // Fullwidth Full Stop (period equivalent)
            || c == 0x2215 // Division Slash (forward slash equivalent)
            || c == 0x2216 // Set Minus (backslash equivalent)
            || (c >= 0xD800 && c <= 0xDFFF) // UTF-16 surrogate pairs
            || c == 0xFFFD // Replacement Character (UTF-8)
            || c == 0xFEFF // Byte Order Mark (BOM)
            || c == '/' || c == '\\' || c == ':' || c == '*' // Illegal characters
            || c == '?' || c == '"' || c == '<' || c == '>' || c == '|') {
            return false;
        }
    }

    // Reject any leading or trailing ' ', or any trailing '.', these are stripped on Windows and will cause a different filename
    // Unicode and other whitespace is not affected, only 0x20 space
    if (filename.front() == ' ' || filename.back() == ' ' || filename.back() == '.') {
        return false;
    }

    // Reject any ".." (currently stricter than necessary, it should be fine to just check for == ".." instead)
    if (filename.find("..") != std::string::npos) {
        return false;
    }

    // Reject "."
    if (filename == ".") {
        return false;
    }

    return true;
}